

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_two_connects.c
# Opt level: O0

int main(void)

{
  cio_address_family cVar1;
  __sighandler_t p_Var2;
  cio_inet_address *inet_address_00;
  undefined8 local_3d8;
  client client;
  cio_socket socket;
  cio_socket_address client_endpoint;
  cio_inet_address inet_address;
  cio_server_socket server_socket;
  cio_error err;
  cio_socket_address endpoint;
  int ret;
  
  p_Var2 = signal(0xf,sighandler);
  if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
    fprintf(_stderr,"could no install SIGTERM handler!\n");
    endpoint.impl.sa._108_4_ = 0xffffffff;
  }
  else {
    p_Var2 = signal(2,sighandler);
    if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
      fprintf(_stderr,"could no install SIGINT handler!\n");
      signal(0xf,(__sighandler_t)0x0);
      endpoint.impl.sa._108_4_ = 0xffffffff;
    }
    else {
      inet_address_00 = cio_get_inet_address_any4();
      server_socket.free_client._0_4_ =
           cio_init_inet_socket_address
                     ((cio_socket_address *)((long)&server_socket.free_client + 4),inet_address_00,
                      0x3039);
      if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
        server_socket.free_client._0_4_ = cio_eventloop_init(&loop);
        if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
          cVar1 = cio_socket_address_get_family
                            ((cio_socket_address *)((long)&server_socket.free_client + 4));
          server_socket.free_client._0_4_ =
               cio_server_socket_init
                         ((cio_server_socket *)((long)&inet_address.impl.field_1 + 8),&loop,5,cVar1,
                          alloc_echo_client,free_echo_client,1000000000,
                          (cio_server_socket_close_hook_t)0x0);
          if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
            server_socket.free_client._0_4_ =
                 cio_server_socket_set_tcp_fast_open
                           ((cio_server_socket *)((long)&inet_address.impl.field_1 + 8),true);
            if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
              server_socket.free_client._0_4_ =
                   cio_server_socket_set_reuse_address
                             ((cio_server_socket *)((long)&inet_address.impl.field_1 + 8),true);
              if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                server_socket.free_client._0_4_ =
                     cio_server_socket_bind
                               ((cio_server_socket *)((long)&inet_address.impl.field_1 + 8),
                                (cio_socket_address *)((long)&server_socket.free_client + 4));
                if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                  server_socket.free_client._0_4_ =
                       cio_server_socket_accept
                                 ((cio_server_socket *)((long)&inet_address.impl.field_1 + 8),
                                  handle_accept,(void *)0x0);
                  if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                    server_socket.free_client._0_4_ =
                         cio_init_inet_address
                                   ((cio_inet_address *)
                                    (client_endpoint.impl.sa.unix_address.un.sun_path + 0x66),"\x7f"
                                    ,4);
                    if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                      server_socket.free_client._0_4_ =
                           cio_init_inet_socket_address
                                     ((cio_socket_address *)&socket.impl.peer_closed_connection,
                                      (cio_inet_address *)
                                      (client_endpoint.impl.sa.unix_address.un.sun_path + 0x66),
                                      0x3039);
                      if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                        cVar1 = cio_socket_address_get_family
                                          ((cio_socket_address *)
                                           ((long)&server_socket.free_client + 4));
                        server_socket.free_client._0_4_ =
                             cio_socket_init((cio_socket *)(client.buffer + 0x78),cVar1,&loop,
                                             1000000000,client_socket_close_hook);
                        if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                          server_socket.free_client._0_4_ =
                               cio_socket_set_tcp_fast_open
                                         ((cio_socket *)(client.buffer + 0x78),true);
                          if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                            local_3d8 = 0;
                            client.bytes_read = 0;
                            server_socket.free_client._0_4_ =
                                 cio_socket_connect((cio_socket *)(client.buffer + 0x78),
                                                    (cio_socket_address *)
                                                    &socket.impl.peer_closed_connection,
                                                    handle_connect,&local_3d8);
                            if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                              server_socket.free_client._0_4_ = cio_eventloop_run(&loop);
                              endpoint.impl.sa._105_3_ = 0;
                              endpoint.impl.sa.unix_address.un.sun_path[0x66] =
                                   (cio_error)server_socket.free_client != CIO_SUCCESS;
                            }
                            else {
                              fprintf(_stderr,"could not connect to server!\n");
                              endpoint.impl.sa._104_4_ = 1;
                              cio_socket_close((cio_socket *)(client.buffer + 0x78));
                            }
                          }
                          else {
                            fprintf(_stderr,
                                    "could not enable TCP FASTOPEN for active (connect) socket!\n");
                            endpoint.impl.sa._104_4_ = 1;
                            cio_socket_close((cio_socket *)(client.buffer + 0x78));
                          }
                        }
                        else {
                          fprintf(_stderr,"could not init client socket endpoint!\n");
                          endpoint.impl.sa._104_4_ = 1;
                        }
                      }
                      else {
                        fprintf(_stderr,"could not init client socket endpoint!\n");
                        endpoint.impl.sa._104_4_ = 1;
                      }
                    }
                    else {
                      fprintf(_stderr,"could not init client socket inet address!\n");
                      endpoint.impl.sa._104_4_ = 1;
                    }
                  }
                  else {
                    fprintf(_stderr,"could not run accept on server socket!\n");
                    endpoint.impl.sa._104_4_ = 1;
                  }
                }
                else {
                  fprintf(_stderr,"could not bind server socket!\n");
                  endpoint.impl.sa._104_4_ = 1;
                }
              }
              else {
                fprintf(_stderr,"could not set reuse_address for server socket!\n");
                endpoint.impl.sa._104_4_ = 1;
              }
            }
            else {
              fprintf(_stderr,"could not set TCP FASTOPEN for server socket!\n");
              endpoint.impl.sa._104_4_ = 1;
            }
            cio_server_socket_close((cio_server_socket *)((long)&inet_address.impl.field_1 + 8));
          }
          else {
            fprintf(_stderr,"could not init server socket!\n");
            endpoint.impl.sa._104_4_ = 1;
          }
          cio_eventloop_destroy(&loop);
          endpoint.impl.sa._108_4_ = endpoint.impl.sa._104_4_;
        }
        else {
          endpoint.impl.sa._108_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"could no init server socket endpoint!\n");
        endpoint.impl.sa._108_4_ = 0xffffffff;
      }
    }
  }
  return endpoint.impl.sa._108_4_;
}

Assistant:

int main(void)
{
	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGTERM handler!\n");
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGINT handler!\n");
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	struct cio_socket_address endpoint;
	enum cio_error err = cio_init_inet_socket_address(&endpoint, cio_get_inet_address_any4(), SERVERSOCKET_LISTEN_PORT);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could no init server socket endpoint!\n");
		return -1;
	}

	err = cio_eventloop_init(&loop);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return EXIT_FAILURE;
	}

	struct cio_server_socket server_socket;
	err = cio_server_socket_init(&server_socket, &loop, SERVERSOCKET_BACKLOG, cio_socket_address_get_family(&endpoint), alloc_echo_client, free_echo_client, CLOSE_TIMEOUT_NS, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init server socket!\n");
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_server_socket_set_tcp_fast_open(&server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not set TCP FASTOPEN for server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_server_socket_set_reuse_address(&server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not set reuse_address for server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_server_socket_bind(&server_socket, &endpoint);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not bind server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_server_socket_accept(&server_socket, handle_accept, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not run accept on server socket!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	static const uint8_t CONNECT_IP[4] = {127, 0, 0, 1};
	struct cio_inet_address inet_address;
	err = cio_init_inet_address(&inet_address, CONNECT_IP, sizeof(CONNECT_IP));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket inet address!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct cio_socket_address client_endpoint;
	err = cio_init_inet_socket_address(&client_endpoint, &inet_address, SERVERSOCKET_LISTEN_PORT);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	struct cio_socket socket;
	err = cio_socket_init(&socket, cio_socket_address_get_family(&endpoint), &loop, CLOSE_TIMEOUT_NS, client_socket_close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_socket_set_tcp_fast_open(&socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not enable TCP FASTOPEN for active (connect) socket!\n");
		ret = EXIT_FAILURE;
		cio_socket_close(&socket);
		goto close_server_socket;
	}

	struct client client;
	client.bytes_read = 0;
	client.number_of_pings = 0;

	err = cio_socket_connect(&socket, &client_endpoint, handle_connect, &client);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "could not connect to server!\n");
		ret = EXIT_FAILURE;
		cio_socket_close(&socket);
		goto close_server_socket;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
	}

close_server_socket:
	cio_server_socket_close(&server_socket);
destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}